

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallSubdirectoryGenerator.cxx
# Opt level: O1

void __thiscall
cmInstallSubdirectoryGenerator::GenerateScript(cmInstallSubdirectoryGenerator *this,ostream *os)

{
  pointer pcVar1;
  PolicyStatus PVar2;
  ostream *poVar3;
  int iVar4;
  string odir;
  string local_40;
  
  if ((this->super_cmInstallGenerator).ExcludeFromAll == false) {
    PVar2 = cmLocalGenerator::GetPolicyStatus(this->LocalGenerator,CMP0082);
    if (PVar2 - NEW < 3) {
      pcVar1 = (this->BinaryDirectory)._M_dataplus._M_p;
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_40,pcVar1,pcVar1 + (this->BinaryDirectory)._M_string_length);
      cmsys::SystemTools::ConvertToUnixSlashes(&local_40);
      std::__ostream_insert<char,std::char_traits<char>>
                (os,"if(NOT CMAKE_INSTALL_LOCAL_ONLY)\n",0x21);
      iVar4 = 2;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
      std::__ostream_insert<char,std::char_traits<char>>
                (os,"# Include the install script for the subdirectory.\n",0x33);
      iVar4 = 2;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
      std::__ostream_insert<char,std::char_traits<char>>(os,"include(\"",9);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,local_40._M_dataplus._M_p,local_40._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"/cmake_install.cmake\")\n",0x17);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"endif()\n\n",9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return;
}

Assistant:

void cmInstallSubdirectoryGenerator::GenerateScript(std::ostream& os)
{
  if (!this->ExcludeFromAll) {
    cmPolicies::PolicyStatus status =
      this->LocalGenerator->GetPolicyStatus(cmPolicies::CMP0082);
    switch (status) {
      case cmPolicies::WARN:
      case cmPolicies::OLD:
        // OLD behavior is handled in cmLocalGenerator::GenerateInstallRules()
        break;

      case cmPolicies::NEW:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS: {
        Indent indent;
        std::string odir = this->BinaryDirectory;
        cmSystemTools::ConvertToUnixSlashes(odir);
        os << indent << "if(NOT CMAKE_INSTALL_LOCAL_ONLY)\n"
           << indent.Next()
           << "# Include the install script for the subdirectory.\n"
           << indent.Next() << "include(\"" << odir
           << "/cmake_install.cmake\")\n"
           << indent << "endif()\n\n";
      } break;
    }
  }
}